

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

void tun_flushwrite(handler *h)

{
  ringbuf *prVar1;
  trans2p *ptVar2;
  uint16_t uVar3;
  ushort uVar4;
  bool bVar5;
  
  ptVar2 = h->t;
  uVar3 = (ptVar2->tun).write.sz;
  if (uVar3 != 0) {
    uVar4 = (ptVar2->tun).write.idx;
    while (bVar5 = uVar3 != 0, uVar3 = uVar3 - 1, bVar5) {
      bVar5 = uVar4 == 0;
      uVar4 = uVar4 - 1;
      if (bVar5) {
        uVar4 = 0x17;
      }
    }
    tun_ringbuf_write((ptVar2->tun).write.buffs[uVar4].buf,(ptVar2->tun).write.buffs[uVar4].sz,
                      &ptVar2->tun);
    prVar1 = &(ptVar2->tun).write;
    prVar1->sz = prVar1->sz - 1;
  }
  return;
}

Assistant:

void tun_flushwrite(struct handler * h)
{
  struct tunif * tun = &h->t->tun;
  ringbuf_pop(&tun->write, &tun_ringbuf_write, tun);
}